

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall tli_window_manager::Text::Text(Text *this,int width,int height,string *initial_str)

{
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_00109da0;
  Box::Box(&this->super_Box);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_position_00109ca8;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00109ce8;
  std::__cxx11::string::string((string *)&this->buffer_,(string *)initial_str);
  this->frame_width_ = width;
  this->frame_height_ = height;
  this->cursor_position_ = 0;
  this->index_ = 0;
  return;
}

Assistant:

Text::Text(int width, int height, std::string initial_str) : frame_width_{width}, buffer_{std::move(initial_str)},
                                                             frame_height_{height}, cursor_position_{0}, index_{0} {}